

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O3

void getOptions(int *argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 *__src;
  uint uVar6;
  long lVar7;
  int iVar8;
  
  builtin_strncpy(commandLine,"Command: ",10);
  if (0 < *argc) {
    sVar4 = strlen(commandLine);
    lVar7 = 0;
    do {
      pcVar2 = argv[lVar7];
      sVar5 = strlen(pcVar2);
      if (999 < sVar5 + ((long)((sVar4 << 0x20) + 0x100000000) >> 0x20)) break;
      strcat(commandLine,pcVar2);
      sVar5 = strlen(commandLine);
      (commandLine + sVar5)[0] = ' ';
      (commandLine + sVar5)[1] = '\0';
      sVar5 = strlen(argv[lVar7]);
      lVar7 = lVar7 + 1;
      sVar4 = ((long)(sVar4 << 0x20) >> 0x20) + 1 + sVar5;
    } while (lVar7 < *argc);
  }
  initOptions();
  iVar8 = *argc;
  __src = (undefined8 *)malloc((long)iVar8 * 8);
  uVar6 = 1;
  *__src = *argv;
  if (1 < (long)iVar8) {
    iVar8 = 1;
    do {
      pcVar2 = argv[iVar8];
      if (*pcVar2 == '-') {
        iVar3 = checkBooleanOption(pcVar2);
        iVar1 = iVar8 + 1;
        if (iVar3 == 0) {
          if (iVar1 < *argc) {
            pcVar2 = argv[iVar8];
            iVar3 = strcmp(*stringOptionTags,pcVar2 + 1);
            if (iVar3 == 0) {
              *stringOptions = argv[iVar1];
            }
            else {
              iVar3 = checkIntOption(pcVar2,argv[iVar1]);
              if (iVar3 == 0) goto LAB_00101c1b;
            }
            iVar1 = iVar8 + 2;
          }
          else {
LAB_00101c1b:
            getOptions_cold_1();
          }
        }
      }
      else {
        lVar7 = (long)(int)uVar6;
        uVar6 = uVar6 + 1;
        __src[lVar7] = pcVar2;
        iVar1 = iVar8 + 1;
      }
      iVar8 = iVar1;
    } while (iVar8 < *argc);
    if ((int)uVar6 < 1) goto LAB_00101c72;
  }
  memcpy(argv,__src,(ulong)uVar6 << 3);
LAB_00101c72:
  *argc = uVar6;
  free(__src);
  if ((booleanOptions[3] == 0) && (booleanOptions[5] == 0)) {
    return;
  }
  printHelp();
  exit(1);
}

Assistant:

void getOptions (int *argc, char * argv[])
{
    char **newArgv;
    int oldp, newp, p, pos;

    strcpy (commandLine, "Command: ");
    pos=strlen(commandLine);
    for (p=0; p<*argc && pos+1+strlen(argv[p])<1000;p++)
    {
        strcat (commandLine, argv[p]);
        strcat (commandLine, " ");
        pos += 1 + strlen (argv[p]);
    }


    initOptions();

    newArgv = (char **) malloc ( (*argc)*sizeof(char *));

    oldp = 0;
    newp = 0;

    newArgv[newp++] = argv[oldp++];

    while (oldp < *argc)
    {
        if (strlen (argv[oldp]) == 0 || argv[oldp][0] != '-')
            newArgv[newp++] = argv[oldp++];
        else
        {
            if (checkBooleanOption (argv[oldp]))
                oldp++;
            else
                if (oldp+1 < *argc && checkStringOption (argv[oldp],argv[oldp+1]))
                    oldp += 2;
            else
                if (oldp+1 < *argc && checkIntOption (argv[oldp],argv[oldp+1]))
                    oldp += 2;
            else
            {
                fprintf (stderr, "Unrecognised option %s\n", argv[oldp]);
                oldp++;
            }
        }

    }

    for (p=0;p<newp;p++)
        argv[p] = newArgv[p];
    *argc = newp;

    free (newArgv);

    if (booleanOptions[HELP] || booleanOptions[HELP_SHORT])
    {
        printHelp();
        exit(1);
    }


}